

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_compressBlock_btlazy2_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *iEnd;
  int iVar1;
  seqStore_t *psVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  uint uVar7;
  U32 UVar8;
  size_t sVar9;
  BYTE *ip;
  ulong uVar10;
  BYTE *pBVar11;
  BYTE *pBVar12;
  BYTE *pBVar13;
  seqDef *psVar14;
  BYTE *pBVar15;
  int *piVar16;
  int *piVar17;
  int *piVar18;
  int iVar19;
  size_t offsetFound;
  uint local_bc;
  size_t local_b8;
  size_t local_a0;
  int *local_98;
  ulong local_90;
  BYTE *local_88;
  BYTE *local_80;
  BYTE *local_78;
  uint local_6c;
  BYTE *local_68;
  ulong local_60;
  int *local_58;
  ZSTD_matchState_t *local_50;
  uint *local_48;
  BYTE *local_40;
  seqStore_t *local_38;
  
  iEnd = (BYTE *)((long)src + srcSize);
  piVar17 = (int *)((long)src + (srcSize - 8));
  local_78 = (ms->window).base;
  local_80 = (ms->window).dictBase;
  uVar5 = (ms->window).dictLimit;
  local_90 = (ulong)uVar5;
  local_60 = (ulong)(ms->window).lowLimit;
  local_88 = local_78 + local_90;
  local_bc = *rep;
  uVar7 = rep[1];
  ms->nextToUpdate3 = ms->nextToUpdate;
  piVar18 = (int *)((ulong)(local_88 == (BYTE *)src) + (long)src);
  local_48 = rep;
  if (piVar18 < piVar17) {
    local_68 = local_80 + local_90;
    local_40 = local_80 + local_60;
    iVar4 = uVar5 - 1;
    local_58 = piVar17;
    local_50 = ms;
    local_38 = seqStore;
    do {
      local_98 = (int *)((long)piVar18 + 1);
      iVar19 = (int)piVar18 - (int)local_78;
      uVar5 = (iVar19 - local_bc) + 1;
      pBVar11 = local_78;
      if (uVar5 < (uint)local_90) {
        pBVar11 = local_80;
      }
      local_6c = uVar7;
      if (((uint)local_60 < uVar5 && 2 < iVar4 - uVar5) && (*local_98 == *(int *)(pBVar11 + uVar5)))
      {
        pBVar12 = iEnd;
        if (uVar5 < (uint)local_90) {
          pBVar12 = local_68;
        }
        sVar6 = ZSTD_count_2segments
                          ((BYTE *)((long)piVar18 + 5),(BYTE *)((long)(pBVar11 + uVar5) + 4),iEnd,
                           pBVar12,local_88);
        uVar10 = sVar6 + 4;
      }
      else {
        uVar10 = 0;
      }
      local_a0 = 999999999;
      sVar6 = ZSTD_BtFindBestMatch_extDict_selectMLS(local_50,(BYTE *)piVar18,iEnd,&local_a0);
      local_b8 = uVar10;
      if (uVar10 < sVar6) {
        local_b8 = sVar6;
      }
      if (local_b8 < 4) {
        piVar18 = (int *)((long)piVar18 + ((long)piVar18 - (long)src >> 8) + 1);
        uVar7 = local_6c;
      }
      else {
        piVar16 = piVar18;
        sVar9 = local_a0;
        if (sVar6 <= uVar10) {
          piVar16 = local_98;
          sVar9 = 0;
        }
        local_98 = piVar16;
        if (piVar18 < piVar17) {
          do {
            piVar16 = (int *)((long)piVar18 + 1);
            if (sVar9 == 0) {
              sVar9 = 0;
            }
            else {
              uVar5 = (iVar19 + 1) - local_bc;
              pBVar11 = local_78;
              if (uVar5 < (uint)local_90) {
                pBVar11 = local_80;
              }
              if (((uint)local_60 < uVar5 && 2 < iVar4 - uVar5) &&
                 (*piVar16 == *(int *)(pBVar11 + uVar5))) {
                pBVar12 = iEnd;
                if (uVar5 < (uint)local_90) {
                  pBVar12 = local_68;
                }
                sVar6 = ZSTD_count_2segments
                                  ((BYTE *)((long)piVar18 + 5),(BYTE *)((long)(pBVar11 + uVar5) + 4)
                                   ,iEnd,pBVar12,local_88);
                if (sVar6 < 0xfffffffffffffffc) {
                  uVar7 = (int)sVar9 + 1;
                  uVar5 = 0x1f;
                  if (uVar7 != 0) {
                    for (; uVar7 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                    }
                  }
                  if ((int)((uVar5 ^ 0x1f) + (int)local_b8 * 3 + -0x1e) < (int)(sVar6 + 4) * 3) {
                    sVar9 = 0;
                    local_b8 = sVar6 + 4;
                    local_98 = piVar16;
                  }
                }
              }
            }
            local_a0 = 999999999;
            sVar6 = ZSTD_BtFindBestMatch_extDict_selectMLS(local_50,(BYTE *)piVar16,iEnd,&local_a0);
            if (sVar6 < 4) {
LAB_001488da:
              piVar17 = local_58;
              if (local_58 <= piVar16) break;
              piVar16 = (int *)((long)piVar18 + 2);
              if (sVar9 == 0) {
                sVar9 = 0;
              }
              else {
                uVar5 = (iVar19 + 2) - local_bc;
                pBVar11 = local_78;
                if (uVar5 < (uint)local_90) {
                  pBVar11 = local_80;
                }
                if (((uint)local_60 < uVar5 && 2 < iVar4 - uVar5) &&
                   (*piVar16 == *(int *)(pBVar11 + uVar5))) {
                  pBVar12 = iEnd;
                  if (uVar5 < (uint)local_90) {
                    pBVar12 = local_68;
                  }
                  sVar6 = ZSTD_count_2segments
                                    ((BYTE *)((long)piVar18 + 6),
                                     (BYTE *)((long)(pBVar11 + uVar5) + 4),iEnd,pBVar12,local_88);
                  if (sVar6 < 0xfffffffffffffffc) {
                    uVar7 = (int)sVar9 + 1;
                    uVar5 = 0x1f;
                    if (uVar7 != 0) {
                      for (; uVar7 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                      }
                    }
                    if ((int)((uVar5 ^ 0x1f) + (int)local_b8 * 4 + -0x1e) < (int)(sVar6 + 4) * 4) {
                      sVar9 = 0;
                      local_b8 = sVar6 + 4;
                      local_98 = piVar16;
                    }
                  }
                }
              }
              local_a0 = 999999999;
              sVar6 = ZSTD_BtFindBestMatch_extDict_selectMLS
                                (local_50,(BYTE *)piVar16,iEnd,&local_a0);
              piVar17 = local_58;
              if (sVar6 < 4) break;
              uVar7 = (int)sVar9 + 1;
              uVar5 = 0x1f;
              if (uVar7 != 0) {
                for (; uVar7 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                }
              }
              uVar7 = (int)local_a0 + 1;
              iVar1 = 0x1f;
              if (uVar7 != 0) {
                for (; uVar7 >> iVar1 == 0; iVar1 = iVar1 + -1) {
                }
              }
              iVar3 = iVar19 + 2;
              if ((int)sVar6 * 4 - iVar1 <= (int)((uVar5 ^ 0x1f) + (int)local_b8 * 4 + -0x18))
              break;
            }
            else {
              uVar7 = (int)sVar9 + 1;
              uVar5 = 0x1f;
              if (uVar7 != 0) {
                for (; uVar7 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                }
              }
              uVar7 = (int)local_a0 + 1;
              iVar1 = 0x1f;
              if (uVar7 != 0) {
                for (; uVar7 >> iVar1 == 0; iVar1 = iVar1 + -1) {
                }
              }
              iVar3 = iVar19 + 1;
              if ((int)sVar6 * 4 - iVar1 <= (int)((uVar5 ^ 0x1f) + (int)local_b8 * 4 + -0x1b))
              goto LAB_001488da;
            }
            iVar19 = iVar3;
            local_b8 = sVar6;
            sVar9 = local_a0;
            piVar17 = local_58;
            piVar18 = piVar16;
            local_98 = piVar16;
          } while (piVar16 < local_58);
        }
        psVar2 = local_38;
        pBVar11 = local_80;
        piVar18 = local_98;
        if (sVar9 == 0) {
          UVar8 = 1;
          uVar5 = local_6c;
        }
        else {
          pBVar15 = (BYTE *)((long)local_98 + (2 - (long)(local_78 + sVar9)));
          pBVar13 = local_88;
          pBVar12 = local_78;
          if ((uint)pBVar15 < (uint)local_90) {
            pBVar13 = local_40;
            pBVar12 = local_80;
          }
          if ((src < local_98) && (uVar10 = (ulong)pBVar15 & 0xffffffff, pBVar13 < pBVar12 + uVar10)
             ) {
            pBVar12 = pBVar12 + uVar10;
            do {
              piVar16 = (int *)((long)piVar18 + -1);
              pBVar12 = pBVar12 + -1;
              if ((*(BYTE *)piVar16 != *pBVar12) ||
                 (local_b8 = local_b8 + 1, piVar18 = piVar16, piVar16 <= src)) break;
            } while (pBVar13 < pBVar12);
          }
          UVar8 = (int)sVar9 + 1;
          uVar5 = local_bc;
          local_bc = (int)sVar9 - 2;
        }
        uVar10 = (long)piVar18 - (long)src;
        pBVar13 = local_38->lit;
        pBVar12 = pBVar13 + uVar10;
        do {
          *(undefined8 *)pBVar13 = *src;
          pBVar13 = pBVar13 + 8;
          src = (void *)((long)src + 8);
        } while (pBVar13 < pBVar12);
        local_38->lit = local_38->lit + uVar10;
        if (uVar10 < 0x10000) {
          psVar14 = local_38->sequences;
        }
        else {
          local_38->longLengthID = 1;
          psVar14 = local_38->sequences;
          local_38->longLengthPos =
               (U32)((ulong)((long)psVar14 - (long)local_38->sequencesStart) >> 3);
        }
        psVar14->litLength = (U16)uVar10;
        psVar14->offset = UVar8;
        if (0xffff < local_b8 - 3) {
          local_38->longLengthID = 2;
          local_38->longLengthPos =
               (U32)((ulong)((long)psVar14 - (long)local_38->sequencesStart) >> 3);
        }
        psVar14->matchLength = (U16)(local_b8 - 3);
        local_38->sequences = psVar14 + 1;
        for (src = (void *)((long)piVar18 + local_b8); uVar7 = uVar5, piVar18 = (int *)src,
            src <= piVar17; src = (void *)((long)src + sVar6 + 4)) {
          uVar5 = (uint)((long)src - (long)(local_78 + uVar7));
          pBVar12 = local_78;
          if (uVar5 < (uint)local_90) {
            pBVar12 = pBVar11;
          }
          if (((uVar5 <= (uint)local_60) || (iVar4 - uVar5 < 3)) ||
             (*src != *(int *)(pBVar12 + ((long)src - (long)(local_78 + uVar7) & 0xffffffff))))
          break;
          pBVar13 = iEnd;
          if (uVar5 < (uint)local_90) {
            pBVar13 = local_68;
          }
          sVar6 = ZSTD_count_2segments
                            ((BYTE *)((long)src + 4),
                             (BYTE *)((long)(pBVar12 +
                                            ((long)src - (long)(local_78 + uVar7) & 0xffffffff)) + 4
                                     ),iEnd,pBVar13,local_88);
          *(undefined8 *)psVar2->lit = *src;
          psVar14 = psVar2->sequences;
          psVar14->litLength = 0;
          psVar14->offset = 1;
          if (0xffff < sVar6 + 1) {
            psVar2->longLengthID = 2;
            psVar2->longLengthPos =
                 (U32)((ulong)((long)psVar14 - (long)psVar2->sequencesStart) >> 3);
          }
          psVar14->matchLength = (U16)(sVar6 + 1);
          psVar2->sequences = psVar14 + 1;
          uVar5 = local_bc;
          local_bc = uVar7;
        }
      }
    } while (piVar18 < piVar17);
  }
  *local_48 = local_bc;
  local_48[1] = uVar7;
  return (long)iEnd - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_btlazy2_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, 1, 2);
}